

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

QueryObject * anon_unknown.dwarf_1a6d0::getQueryObj(HelicsQuery query,HelicsError *err)

{
  HelicsError *in_RSI;
  QueryObject *in_RDI;
  QueryObject *queryPtr;
  QueryObject *local_8;
  
  if ((in_RSI == (HelicsError *)0x0) || (in_RSI->error_code == 0)) {
    if (in_RDI == (QueryObject *)0x0) {
      assignError(in_RSI,-3,"Query object is invalid");
      local_8 = (QueryObject *)0x0;
    }
    else {
      local_8 = in_RDI;
      if (in_RDI->valid != 0x27063885) {
        assignError(in_RSI,-3,"Query object is invalid");
        local_8 = (QueryObject *)0x0;
      }
    }
  }
  else {
    local_8 = (QueryObject *)0x0;
  }
  return local_8;
}

Assistant:

helics::QueryObject* getQueryObj(HelicsQuery query, HelicsError* err)
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }
    if (query == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidQueryString);
        return nullptr;
    }
    auto* queryPtr = reinterpret_cast<helics::QueryObject*>(query);
    if (queryPtr->valid != validQueryIdentifier) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidQueryString);
        return nullptr;
    }
    return queryPtr;
}